

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

void __thiscall
chaiscript::dispatch::Bound_Function::Bound_Function
          (Bound_Function *this,Const_Proxy_Function *t_f,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_args)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_48;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_30;
  
  build_param_type_info(&local_48,t_f,t_args);
  if (((t_f->
       super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr)->m_arity < 0) {
    Proxy_Function_Base::Proxy_Function_Base(&this->super_Proxy_Function_Base,&local_48,-1);
  }
  else {
    build_param_type_info(&local_30,t_f,t_args);
    Proxy_Function_Base::Proxy_Function_Base
              (&this->super_Proxy_Function_Base,&local_48,
               (int)((ulong)((long)local_30.
                                   super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_30.
                                  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 +
               -1);
    if (local_30.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.
                      super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_30.
                            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.
                            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_48.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Bound_Function_003b6170;
  (this->m_f).
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (t_f->
           super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var2 = (t_f->
           super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->m_f).
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            (&this->m_args,t_args);
  iVar1 = ((this->m_f).
           super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->m_arity;
  if ((-1 < iVar1) &&
     (iVar1 != (int)((ulong)((long)(this->m_args).
                                   super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_args).
                                  super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
    __assert_fail("m_f->get_arity() < 0 || m_f->get_arity() == static_cast<int>(m_args.size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/dispatchkit/proxy_functions.hpp"
                  ,0x1be,
                  "chaiscript::dispatch::Bound_Function::Bound_Function(const Const_Proxy_Function &, const std::vector<Boxed_Value> &)"
                 );
  }
  return;
}

Assistant:

Bound_Function(const Const_Proxy_Function &t_f, const std::vector<Boxed_Value> &t_args)
          : Proxy_Function_Base(build_param_type_info(t_f, t_args),
                                (t_f->get_arity() < 0 ? -1 : static_cast<int>(build_param_type_info(t_f, t_args).size()) - 1))
          , m_f(t_f)
          , m_args(t_args) {
        assert(m_f->get_arity() < 0 || m_f->get_arity() == static_cast<int>(m_args.size()));
      }